

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int Run<std::_Bind<int(*(AmsNetId,unsigned_short,std::__cxx11::string,bhf::Commandline))(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)>>
              (_Bind<int_(*(AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline))(AmsNetId,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bhf::Commandline_&)>
               *f,size_t retries)

{
  int iVar1;
  string local_458 [32];
  stringstream local_438 [8];
  stringstream stream_1;
  ostream local_428 [376];
  _Bind<int_(*(AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline))(AmsNetId,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bhf::Commandline_&)>
  local_2b0;
  int local_24c;
  duration<long,std::ratio<1l,1l>> local_248 [8];
  string local_240 [32];
  stringstream local_220 [8];
  stringstream stream;
  ostream local_210 [392];
  _Bind<int_(*(AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline))(AmsNetId,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bhf::Commandline_&)>
  local_88;
  int local_24;
  size_t sStack_20;
  int result;
  size_t retries_local;
  _Bind<int_(*(AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline))(AmsNetId,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bhf::Commandline_&)>
  *f_local;
  
  sStack_20 = retries;
  retries_local = (size_t)f;
  std::
  _Bind<int_(*(AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline))(AmsNetId,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bhf::Commandline_&)>
  ::_Bind(&local_88,f);
  iVar1 = TryRun<std::_Bind<int(*(AmsNetId,unsigned_short,std::__cxx11::string,bhf::Commandline))(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)>>
                    (&local_88);
  std::
  _Bind<int_(*(AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline))(AmsNetId,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bhf::Commandline_&)>
  ::~_Bind(&local_88);
  f_local._4_4_ = iVar1;
  if ((iVar1 != 0) && (local_24 = iVar1, sStack_20 != 0)) {
    do {
      if (sStack_20 == 0) {
        sStack_20 = sStack_20 - 1;
        std::__cxx11::stringstream::stringstream(local_438);
        std::operator<<(local_428,"Too many retries, giving up!\n");
        std::__cxx11::stringstream::str();
        Logger::Log(3,local_458);
        std::__cxx11::string::~string(local_458);
        std::__cxx11::stringstream::~stringstream(local_438);
        return local_24;
      }
      sStack_20 = sStack_20 - 1;
      std::__cxx11::stringstream::stringstream(local_220);
      std::operator<<(local_210,"Command failed, retrying...\n");
      std::__cxx11::stringstream::str();
      Logger::Log(2,local_240);
      std::__cxx11::string::~string(local_240);
      std::__cxx11::stringstream::~stringstream(local_220);
      local_24c = 1;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_248,&local_24c);
      std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                ((duration<long,_std::ratio<1L,_1L>_> *)local_248);
      std::
      _Bind<int_(*(AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline))(AmsNetId,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bhf::Commandline_&)>
      ::_Bind(&local_2b0,f);
      local_24 = TryRun<std::_Bind<int(*(AmsNetId,unsigned_short,std::__cxx11::string,bhf::Commandline))(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)>>
                           (&local_2b0);
      std::
      _Bind<int_(*(AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline))(AmsNetId,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bhf::Commandline_&)>
      ::~_Bind(&local_2b0);
    } while (local_24 != 0);
    f_local._4_4_ = 0;
  }
  return f_local._4_4_;
}

Assistant:

int Run(T f, size_t retries)
{
    auto result = TryRun(f);

    // success or no retry allowed
    if (!result || !retries) {
        return result;
    }

    while (retries-- > 0) {
        LOG_WARN("Command failed, retrying...\n");
        std::this_thread::sleep_for(std::chrono::seconds(1));
        result = TryRun(f);
        if (!result) {
            return 0;
        }
    }
    LOG_ERROR("Too many retries, giving up!\n");
    return result;
}